

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O1

void __thiscall
net_tests::anon_unknown_17::V2TransportTester::ReceiveVersion(V2TransportTester *this)

{
  byte *pbVar1;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  Span<const_std::byte> aad;
  vector<unsigned_char,_std::allocator<unsigned_char>_> contents;
  check_type cVar2;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  lazy_ostream local_88;
  undefined1 *local_78;
  char **local_70;
  assertion_result local_68;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar1 = (this->m_recv_garbage).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  aad.m_size = (long)(this->m_recv_garbage).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pbVar1;
  aad.m_data = pbVar1;
  ReceivePacket(&local_30,this,aad);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x4f2;
  file.m_begin = (iterator)&local_40;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_50,msg);
  local_68.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start ==
       local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish);
  local_68.m_message.px = (element_type *)0x0;
  local_68.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_70 = &local_98;
  local_98 = "contents.empty()";
  local_90 = "";
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_a0 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_68,&local_88,1,0,WARN,_cVar2,(size_t)&local_a8,0x4f2);
  boost::detail::shared_count::~shared_count(&local_68.m_message.pn);
  if (local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ReceiveVersion()
    {
        auto contents = ReceivePacket(/*aad=*/MakeByteSpan(m_recv_garbage));
        // Version packets from real BIP324 peers are expected to be empty, despite the fact that
        // this class supports *sending* non-empty version packets (to test that BIP324 peers
        // correctly ignore version packet contents).
        BOOST_CHECK(contents.empty());
    }